

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlexer.cpp
# Opt level: O0

SQInteger __thiscall SQLexer::ProcessStringHexEscape(SQLexer *this,SQChar *dest,SQInteger maxdigits)

{
  int iVar1;
  long in_RDX;
  long in_RSI;
  SQLexer *in_RDI;
  SQInteger n;
  long local_20;
  
  Next(in_RDI);
  in_RDI->_currentcolumn = in_RDI->_currentcolumn + 1;
  iVar1 = isxdigit((uint)in_RDI->_currdata);
  if (iVar1 == 0) {
    SQCompilation::SQCompilationContext::reportDiagnostic
              (in_RDI->_ctx,DI_HEX_NUMBERS_EXPECTED,(int32_t)(in_RDI->_tokenline & 0xffffffff),
               (int32_t)(in_RDI->_tokencolumn & 0xffffffff),
               (int32_t)(ulong)(uint)((int)in_RDI->_currentcolumn - (int)in_RDI->_tokencolumn));
  }
  local_20 = 0;
  while (iVar1 = isxdigit((uint)in_RDI->_currdata), iVar1 != 0 && local_20 < in_RDX) {
    *(LexChar *)(in_RSI + local_20) = in_RDI->_currdata;
    local_20 = local_20 + 1;
    Next(in_RDI);
    in_RDI->_currentcolumn = in_RDI->_currentcolumn + 1;
  }
  *(undefined1 *)(in_RSI + local_20) = 0;
  return local_20;
}

Assistant:

SQInteger SQLexer::ProcessStringHexEscape(SQChar *dest, SQInteger maxdigits)
{
    NEXT();
    if (!isxdigit(CUR_CHAR))
        _ctx.reportDiagnostic(DiagnosticsId::DI_HEX_NUMBERS_EXPECTED, _tokenline, _tokencolumn, _currentcolumn - _tokencolumn);
    SQInteger n = 0;
    while (isxdigit(CUR_CHAR) && n < maxdigits) {
        dest[n] = CUR_CHAR;
        n++;
        NEXT();
    }
    dest[n] = 0;
    return n;
}